

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O3

TypedExpectation<void_()> * __thiscall
testing::internal::FunctionMocker<void_()>::AddNewExpectation
          (FunctionMocker<void_()> *this,char *file,int line,string *source_text,
          ArgumentMatcherTuple *m)

{
  Sequence *this_00;
  void *mock_obj;
  TypedExpectation<void_()> *__p;
  Sequence **ppSVar1;
  shared_ptr<testing::internal::ExpectationBase> untyped_expectation;
  value_type local_48;
  Expectation local_38;
  
  mock_obj = UntypedFunctionMockerBase::MockObject(&this->super_UntypedFunctionMockerBase);
  Mock::RegisterUseByOnCallOrExpectCall(mock_obj,file,line);
  __p = (TypedExpectation<void_()> *)operator_new(0x130);
  ExpectationBase::ExpectationBase((ExpectationBase *)__p,file,line,source_text);
  (__p->super_ExpectationBase)._vptr_ExpectationBase = (_func_int **)&PTR__TypedExpectation_00319570
  ;
  __p->owner_ = this;
  (__p->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>.vtable_ =
       (VTable *)
       MatcherBase<std::tuple<>const&>::
       GetVTable<testing::internal::MatcherBase<std::tuple<>const&>::ValuePolicy<testing::internal::AnythingMatcher,true>>()
       ::kVTable;
  (__p->extra_matcher_).super_MatcherBase<const_std::tuple<>_&>.super_MatcherDescriberInterface.
  _vptr_MatcherDescriberInterface = (_func_int **)&PTR__MatcherBase_003195b8;
  *(undefined8 *)&(__p->repeated_action_).fun_.super__Function_base._M_functor = 0;
  *(undefined8 *)((long)&(__p->repeated_action_).fun_.super__Function_base._M_functor + 8) = 0;
  (__p->repeated_action_).fun_.super__Function_base._M_manager = (_Manager_type)0x0;
  (__p->repeated_action_).fun_._M_invoker = (_Invoker_type)0x0;
  local_48.super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)__p;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<testing::internal::TypedExpectation<void()>*>
            (&local_48.
              super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
              _M_refcount,__p);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::push_back(&(this->super_UntypedFunctionMockerBase).untyped_expectations_,&local_48);
  ppSVar1 = ThreadLocal<testing::Sequence_*>::GetOrCreateValue
                      ((ThreadLocal<testing::Sequence_*> *)g_gmock_implicit_sequence);
  this_00 = *ppSVar1;
  if (this_00 != (Sequence *)0x0) {
    Expectation::Expectation(&local_38,&local_48);
    Sequence::AddExpectation(this_00,&local_38);
    Expectation::~Expectation(&local_38);
  }
  if (local_48.super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
      _M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_48.
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>.
               _M_refcount._M_pi);
  }
  return __p;
}

Assistant:

GTEST_LOCK_EXCLUDED_(g_gmock_mutex) {
    Mock::RegisterUseByOnCallOrExpectCall(MockObject(), file, line);
    TypedExpectation<F>* const expectation =
        new TypedExpectation<F>(this, file, line, source_text, m);
    const std::shared_ptr<ExpectationBase> untyped_expectation(expectation);
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    untyped_expectations_.push_back(untyped_expectation);

    // Adds this expectation into the implicit sequence if there is one.
    Sequence* const implicit_sequence = g_gmock_implicit_sequence.get();
    if (implicit_sequence != nullptr) {
      implicit_sequence->AddExpectation(Expectation(untyped_expectation));
    }

    return *expectation;
  }